

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<std::complex<long_double>_>::Compress(TPZFrontSym<std::complex<long_double>_> *this)

{
  long *plVar1;
  long *plVar2;
  int64_t iVar3;
  complex<long_double> *pcVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  TPZStack<long,_10> from;
  TPZManVector<long,_10> local_90;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_90);
  if (0 < (this->super_TPZFront<std::complex<long_double>_>).fFront) {
    lVar16 = 0;
    do {
      if ((this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore
          [lVar16] != -1) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_90,lVar16);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->super_TPZFront<std::complex<long_double>_>).fFront);
  }
  if (local_90.super_TPZVec<long>.fNElements < 1) {
    lVar16 = 0;
  }
  else {
    plVar1 = (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore;
    plVar2 = (this->super_TPZFront<std::complex<long_double>_>).fLocal.fStore;
    lVar12 = 0;
    do {
      lVar16 = plVar1[local_90.super_TPZVec<long>.fStore[lVar12]];
      plVar1[lVar12] = lVar16;
      plVar2[lVar16] = lVar12;
      lVar12 = lVar12 + 1;
      lVar16 = local_90.super_TPZVec<long>.fNElements;
    } while (local_90.super_TPZVec<long>.fNElements != lVar12);
  }
  if (lVar16 < (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.
               fNElements) {
    plVar1 = (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore;
    lVar12 = lVar16;
    do {
      plVar1[lVar12] = -1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.
                      fNElements);
  }
  if ((this->super_TPZFront<std::complex<long_double>_>).fFree.super_TPZManVector<int,_10>.
      super_TPZVec<int>.fNElements + local_90.super_TPZVec<long>.fNElements !=
      (this->super_TPZFront<std::complex<long_double>_>).fFront) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n",0x2e);
  }
  iVar3 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  (this->super_TPZFront<std::complex<long_double>_>).fFront = local_90.super_TPZVec<long>.fNElements
  ;
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<std::complex<long_double>_>).fFree.super_TPZManVector<int,_10>,0
            );
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<std::complex<long_double>_>).fGlobal,
             (this->super_TPZFront<std::complex<long_double>_>).fFront);
  if ((this->super_TPZFront<std::complex<long_double>_>).fData.fNElements != 0) {
    if (local_90.super_TPZVec<long>.fNElements < 1) {
      local_90.super_TPZVec<long>.fNElements = 0;
    }
    else {
      lVar12 = 1;
      lVar10 = 0;
      do {
        lVar11 = 0;
        do {
          lVar14 = local_90.super_TPZVec<long>.fStore[lVar11];
          lVar13 = local_90.super_TPZVec<long>.fStore[lVar10];
          lVar15 = lVar13;
          if (lVar13 < lVar14) {
            lVar15 = lVar14;
          }
          if (lVar14 < lVar13) {
            lVar13 = lVar14;
          }
          lVar15 = (lVar15 + 1) * lVar15;
          pcVar4 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
          uVar5 = lVar15 - (lVar15 >> 0x3f) & 0xffffffffffffffe;
          lVar14 = lVar10;
          if (lVar10 < lVar11) {
            lVar14 = lVar11;
          }
          lVar15 = lVar10;
          if (lVar11 < lVar10) {
            lVar15 = lVar11;
          }
          uVar6 = (lVar14 + 1) * lVar14 & 0xffffffffffffffe;
          uVar7 = *(undefined8 *)(pcVar4[lVar13]._M_value + uVar5 * 0x10);
          uVar8 = *(undefined8 *)((long)(pcVar4[lVar13]._M_value + uVar5 * 0x10) + 8);
          uVar9 = *(undefined8 *)((long)(pcVar4[lVar13]._M_value + uVar5 * 0x10 + 0x10) + 8);
          *(undefined8 *)(pcVar4[lVar15]._M_value + uVar6 * 0x10 + 0x10) =
               *(undefined8 *)(pcVar4[lVar13]._M_value + uVar5 * 0x10 + 0x10);
          *(undefined8 *)((long)(pcVar4[lVar15]._M_value + uVar6 * 0x10 + 0x10) + 8) = uVar9;
          *(undefined8 *)(pcVar4[lVar15]._M_value + uVar6 * 0x10) = uVar7;
          *(undefined8 *)((long)(pcVar4[lVar15]._M_value + uVar6 * 0x10) + 8) = uVar8;
          lVar11 = lVar11 + 1;
        } while (lVar12 != lVar11);
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar10 != local_90.super_TPZVec<long>.fNElements);
    }
    lVar12 = (long)(int)iVar3;
    if (local_90.super_TPZVec<long>.fNElements < lVar12) {
      do {
        lVar10 = lVar16 + 1;
        lVar11 = 0;
        do {
          lVar14 = lVar16;
          if (lVar16 < lVar11) {
            lVar14 = lVar11;
          }
          lVar13 = lVar16;
          if (lVar11 < lVar16) {
            lVar13 = lVar11;
          }
          uVar5 = (lVar14 + 1) * lVar14 & 0xffffffffffffffe;
          pcVar4 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
          *(longdouble *)(pcVar4[lVar13]._M_value + uVar5 * 0x10) = (longdouble)0;
          *(longdouble *)(pcVar4[lVar13]._M_value + uVar5 * 0x10 + 0x10) = (longdouble)0;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
        lVar16 = lVar10;
      } while (lVar10 != lVar12);
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&local_90);
  return;
}

Assistant:

void TPZFrontSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress",output);
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	int frontold = this->fFront;
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i <= j; i++){
			Element(i,j) = Element(from[i], from[j]);
		}
		//		fGlobal[i] = fGlobal[from[i]];
		//		this->fLocal[fGlobal[i]] = i;
	}
	for(;j<frontold;j++) {
		for(i=0;i<= j; i++) Element(i,j) = 0.;
	}
	
	//	Print("After Compress", cout);
	//	PrintGlobal("After Compress",output);
}